

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O2

int faup_snapshot_append_item(faup_snapshot_t *snapshot,char *item_name,faup_snapshot_item_t *item)

{
  size_t sVar1;
  faup_snapshot_item_t **ppfVar2;
  faup_snapshot_item_t *pfVar3;
  char *__ptr;
  size_t sStack_20;
  
  if (snapshot == (faup_snapshot_t *)0x0) {
    __ptr = "Cannot append item to an unexisting snapshot!\n";
    sStack_20 = 0x2e;
  }
  else {
    ppfVar2 = (faup_snapshot_item_t **)realloc(snapshot->items,snapshot->length * 8 + 8);
    snapshot->items = ppfVar2;
    if (ppfVar2 != (faup_snapshot_item_t **)0x0) {
      pfVar3 = faup_snapshot_item_copy(item);
      sVar1 = snapshot->length;
      snapshot->items[sVar1] = pfVar3;
      snapshot->length = sVar1 + 1;
      return 0;
    }
    __ptr = "Cannot allocatate a snapshot_item!\n";
    sStack_20 = 0x23;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  return -1;
}

Assistant:

int faup_snapshot_append_item(faup_snapshot_t *snapshot, char *item_name, faup_snapshot_item_t *item)
{
  if (!snapshot) {
    fprintf(stderr, "Cannot append item to an unexisting snapshot!\n");
    return -1;
  }
  
  snapshot->items = realloc(snapshot->items, sizeof(faup_snapshot_item_t *) * (snapshot->length + 1));
  if (!snapshot->items) {
    fprintf(stderr, "Cannot allocatate a snapshot_item!\n");
    return -1;
  }

  snapshot->items[snapshot->length] = faup_snapshot_item_copy(item);
  
  snapshot->length++;
  
  return 0;
  
}